

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleNoResponse(HttpServerErrorHandler *this,Response *response)

{
  undefined8 *in_RDX;
  StringPtr value;
  undefined1 local_d8 [8];
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  HttpHeaderTable headerTable;
  HttpHeaders headers;
  
  HttpHeaderTable::HttpHeaderTable(&headerTable);
  HttpHeaders::HttpHeaders(&headers,&headerTable);
  value.content.size_ = 0xb;
  value.content.ptr = "text/plain";
  anon_unknown_36::requireValidHeaderValue(value);
  headers.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
  headers.indexedHeaders.ptr[0xe].content.size_ = 0xb;
  (**(code **)*in_RDX)(&body);
  (**(body.ptr)->_vptr_AsyncOutputStream)
            (local_d8,body.ptr,"ERROR: The HttpService did not generate a response.",0x33);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_d8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_d8);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose(&body);
  HttpHeaders::~HttpHeaders(&headers);
  HttpHeaderTable::~HttpHeaderTable(&headerTable);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleNoResponse(kj::HttpService::Response& response) {
  HttpHeaderTable headerTable {};
  HttpHeaders headers(headerTable);
  headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

  constexpr auto errorMessage = "ERROR: The HttpService did not generate a response."_kj;
  auto body = response.send(500, "Internal Server Error", headers, errorMessage.size());

  return body->write(errorMessage.asBytes()).attach(kj::mv(body));
}